

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# servak.cpp
# Opt level: O0

string * hex2bin(string *__return_storage_ptr__,string *s)

{
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  bool bVar1;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  const_iterator pos;
  string extract;
  string *s_local;
  string *sOut;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::__cxx11::string::length();
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  std::__cxx11::string::string((string *)&pos);
  local_60._M_current = (char *)std::__cxx11::string::begin();
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_58,&local_60);
  while( true ) {
    local_68._M_current = (char *)std::__cxx11::string::end();
    bVar1 = __gnu_cxx::operator<(&local_58,&local_68);
    __first._M_current = local_58._M_current;
    if (!bVar1) break;
    __last = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator+(&local_58,2);
    std::__cxx11::string::
    assign<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
              ((string *)&pos,__first,__last);
    std::__cxx11::stoi((string *)&pos,(size_t *)0x0,0x10);
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator+=(&local_58,2);
  }
  std::__cxx11::string::~string((string *)&pos);
  return __return_storage_ptr__;
}

Assistant:

std::string hex2bin(std::string s) {
//    std::cout<<"String to dehash: "<<s<<std::endl;
//    if(s.length()&1) - no need at all as we know that s is bin2hex string
//        s = "0"+s;

    std::string sOut;
    sOut.reserve(s.length()/2);

    std::string extract;
    for (std::string::const_iterator pos = s.begin(); pos<s.end(); pos += 2)
    {
        extract.assign(pos, pos+2);
        sOut.push_back(std::stoi(extract, nullptr, 16));
    }
    return sOut;
}